

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int CollectionSetHeader(unqlite_kv_engine *pEngine,unqlite_col *pCol,jx9_int64 iRec,jx9_int64 iTotal
                       ,jx9_value *pSchema)

{
  SyBlob *pBlob;
  unqlite_kv_methods *puVar1;
  void *pvVar2;
  sxi32 sVar3;
  int iVar4;
  unqlite_vfs *pVfs;
  uchar zBuf [2];
  sxu32 iDos;
  undefined8 local_40;
  sxu32 local_34;
  
  if (pEngine == (unqlite_kv_engine *)0x0) {
    pEngine = ((pCol->pVm->pDb->sDB).pPager)->pEngine;
  }
  pBlob = &pCol->sHeader;
  puVar1 = pEngine->pIo->pMethods;
  if ((pCol->sHeader).nByte == 0) {
    local_40 = CONCAT62(local_40._2_6_,0x1e61);
    sVar3 = SyBlobAppend(pBlob,&local_40,2);
    if (sVar3 != 0) {
      return sVar3;
    }
    local_40 = 0;
    sVar3 = SyBlobAppend(pBlob,&local_40,8);
    if (sVar3 != 0) {
      return sVar3;
    }
    local_40 = 0;
    pVfs = (unqlite_vfs *)pBlob;
    sVar3 = SyBlobAppend(pBlob,&local_40,8);
    if (sVar3 != 0) {
      return sVar3;
    }
    unixCurrentTime(pVfs,&pCol->sCreation);
    SyTimeFormatToDos(&pCol->sCreation,&local_34);
    sVar3 = SyBlobAppendBig32(pBlob,local_34);
    if (sVar3 != 0) {
      return sVar3;
    }
    pCol->nSchemaOfft = (pCol->sHeader).nByte;
  }
  else {
    pvVar2 = (pCol->sHeader).pBlob;
    if (-1 < iRec) {
      *(ulong *)((long)pvVar2 + 2) =
           (ulong)iRec >> 0x38 | (iRec & 0xff000000000000U) >> 0x28 |
           (iRec & 0xff0000000000U) >> 0x18 | (iRec & 0xff00000000U) >> 8 |
           (iRec & 0xff000000U) << 8 | (iRec & 0xff0000U) << 0x18 | (iRec & 0xff00U) << 0x28 |
           iRec << 0x38;
    }
    if (iTotal < 0) {
      if (pSchema == (jx9_value *)0x0) {
        if (iRec < 0) {
          return 0;
        }
        goto LAB_00119b91;
      }
    }
    else {
      *(ulong *)((long)pvVar2 + 10) =
           (ulong)iTotal >> 0x38 | (iTotal & 0xff000000000000U) >> 0x28 |
           (iTotal & 0xff0000000000U) >> 0x18 | (iTotal & 0xff00000000U) >> 8 |
           (iTotal & 0xff000000U) << 8 | (iTotal & 0xff0000U) << 0x18 | (iTotal & 0xff00U) << 0x28 |
           iTotal << 0x38;
      if (pSchema == (jx9_value *)0x0) goto LAB_00119b91;
    }
    if (pCol->nSchemaOfft < (pCol->sHeader).nByte) {
      (pCol->sHeader).nByte = pCol->nSchemaOfft;
    }
    sVar3 = FastJsonEncode(pSchema,pBlob,0);
    if (sVar3 != 0) {
      return sVar3;
    }
    jx9MemObjStore(pSchema,&pCol->sSchema);
  }
LAB_00119b91:
  iVar4 = (*puVar1->xReplace)(pEngine,(pCol->sName).zString,(pCol->sName).nByte,
                              (pCol->sHeader).pBlob,(unqlite_int64)(pCol->sHeader).nByte);
  if (iVar4 == 0) {
    return 0;
  }
  unqliteGenErrorFormat
            (pCol->pVm->pDb,"Cannot save collection \'%z\' header in the underlying storage engine",
             &pCol->sName);
  return iVar4;
}

Assistant:

static int CollectionSetHeader(
	unqlite_kv_engine *pEngine, /* Underlying KV storage engine */
	unqlite_col *pCol,          /* Target collection */
	jx9_int64 iRec,             /* Last record ID */
	jx9_int64 iTotal,           /* Total number of records in this collection */
	jx9_value *pSchema          /* Collection schema */
	)
{
	SyBlob *pHeader = &pCol->sHeader;
	unqlite_kv_methods *pMethods;
	int iWrite = 0;
	int rc;
	if( pEngine == 0 ){
		/* Default storage engine */
		pEngine = unqlitePagerGetKvEngine(pCol->pVm->pDb);
	}
	pMethods = pEngine->pIo->pMethods;
	if( SyBlobLength(pHeader) < 1 ){
		Sytm *pCreate = &pCol->sCreation; /* Creation time */
		unqlite_vfs *pVfs;
		sxu32 iDos;
		/* Magic number */
		rc = SyBlobAppendBig16(pHeader,UNQLITE_COLLECTION_MAGIC);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initial record ID */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Total records in the collection */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		pVfs = (unqlite_vfs *)unqliteExportBuiltinVfs();
		/* Creation time of the collection */
		if( pVfs->xCurrentTime ){
			/* Get the creation time */
			pVfs->xCurrentTime(pVfs,pCreate);
		}else{
			/* Zero the structure */
			SyZero(pCreate,sizeof(Sytm));
		}
		/* Convert to DOS time */
		SyTimeFormatToDos(pCreate,&iDos);
		rc = SyBlobAppendBig32(pHeader,iDos);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Offset to start writing collection schema */
		pCol->nSchemaOfft = SyBlobLength(pHeader);
		iWrite = 1;
	}else{
		unsigned char *zBinary = (unsigned char *)SyBlobData(pHeader);
		/* Header update */
		if( iRec >= 0 ){
			/* Update record ID */
			SyBigEndianPack64(&zBinary[2/* Magic number*/],(sxu64)iRec);
			iWrite = 1;
		}
		if( iTotal >= 0 ){
			/* Total records */
			SyBigEndianPack64(&zBinary[2/* Magic number*/+8/* Record ID*/],(sxu64)iTotal);
			iWrite = 1;
		}
		if( pSchema ){
			/* Collection Schema */
			SyBlobTruncate(pHeader,pCol->nSchemaOfft);
			/* Encode the schema to FastJson */
			rc = FastJsonEncode(pSchema,pHeader,0);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Copy the collection schema */
			jx9MemObjStore(pSchema,&pCol->sSchema);
			iWrite = 1;
		}
	}
	if( iWrite ){
		SyString *pId = &pCol->sName;
		/* Reflect the disk and/or in-memory image */
		rc = pMethods->xReplace(pEngine,
			(const void *)pId->zString,pId->nByte,
			SyBlobData(pHeader),SyBlobLength(pHeader)
			);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot save collection '%z' header in the underlying storage engine",
				pId
				);
			return rc;
		}
	}
	return UNQLITE_OK;
}